

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionMeshCollection.cpp
# Opt level: O0

aphy_error __thiscall
APhyBullet::APhyBulletCollisionMeshCollection::addCollisionMeshAccessor
          (APhyBulletCollisionMeshCollection *this,aphy_collision_mesh_accessor *accessor,
          aphy_transform *transform)

{
  long in_RDX;
  long in_RSI;
  btIndexedMesh *in_RDI;
  btIndexedMesh indexedMesh;
  btTransform *in_stack_00000110;
  aphy_collision_mesh_accessor *in_stack_00000118;
  APhyBulletCollisionMeshCollection *in_stack_00000120;
  undefined8 in_stack_ffffffffffffff60;
  PHY_ScalarType indexType;
  undefined4 in_stack_ffffffffffffff74;
  aphy_transform *in_stack_ffffffffffffffa8;
  aphy_error local_4;
  
  indexType = (PHY_ScalarType)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  if (in_RSI == 0) {
    local_4 = APHY_NULL_POINTER;
  }
  else if (in_RDX == 0) {
    btIndexedMesh::btIndexedMesh((btIndexedMesh *)&stack0xffffffffffffff70);
    btTriangleIndexVertexArray::addIndexedMesh
              ((btTriangleIndexVertexArray *)
               CONCAT44(in_stack_ffffffffffffff74,*(uint *)(in_RSI + 0x28) / 3),in_RDI,indexType);
    local_4 = APHY_OK;
  }
  else {
    convertAPhyTransform(in_stack_ffffffffffffffa8);
    local_4 = addCollisionMeshAccessorWithTransform
                        (in_stack_00000120,in_stack_00000118,in_stack_00000110);
  }
  return local_4;
}

Assistant:

aphy_error APhyBulletCollisionMeshCollection::addCollisionMeshAccessor(aphy_collision_mesh_accessor* accessor, aphy_transform* transform)
{
    CHECK_POINTER(accessor);

    if(transform)
        return addCollisionMeshAccessorWithTransform(accessor, convertAPhyTransform(*transform));

    btIndexedMesh indexedMesh;
    indexedMesh.m_numTriangles = accessor->index_count / 3;
    indexedMesh.m_triangleIndexBase = reinterpret_cast<uint8_t*> (accessor->indices) + accessor->index_offset;
    indexedMesh.m_triangleIndexStride = accessor->index_stride * 3;
    indexedMesh.m_numVertices = accessor->vertex_count;
    indexedMesh.m_vertexBase = reinterpret_cast<uint8_t*> (accessor->vertices) + accessor->vertex_offset;
    indexedMesh.m_vertexStride = accessor->vertex_stride;
    indexedMesh.m_vertexType = PHY_FLOAT;
    //printf("m_vertexBase %p m_triangleIndexBase %p\n", indexedMesh.m_vertexBase, indexedMesh.m_triangleIndexBase);
    //printf("m_numTriangles %d m_triangleIndexStride %d m_numVertices %d m_vertexStride %d\n", indexedMesh.m_numTriangles, indexedMesh.m_triangleIndexStride, indexedMesh.m_numVertices, indexedMesh.m_vertexStride);
    triangleMeshData.addIndexedMesh(indexedMesh, accessor->index_stride == 2 ? PHY_SHORT : PHY_INTEGER);
    return APHY_OK;
}